

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O3

HeaderState __thiscall HttpData::parseHeaders(HttpData *this)

{
  string *this_00;
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  HeaderState HVar4;
  mapped_type *this_01;
  ulong uVar5;
  size_type __pos;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_type __pos_00;
  string key;
  string value;
  int local_84;
  int local_80;
  int local_7c;
  key_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  this_00 = &this->inBuffer_;
  uVar5 = (this->inBuffer_)._M_string_length;
  __pos = 0;
  if (uVar5 == 0) {
    __pos_00 = 0;
  }
  else {
    local_38 = &this->headers_;
    iVar6 = -1;
    local_80 = -1;
    local_84 = -1;
    local_7c = -1;
    uVar3 = 0;
    do {
      uVar8 = uVar3;
      iVar7 = (int)uVar8;
      switch(this->hState_) {
      case H_START:
        cVar1 = (this_00->_M_dataplus)._M_p[uVar8];
        if ((cVar1 != '\n') && (cVar1 != '\r')) {
          this->hState_ = H_KEY;
          __pos = uVar8 & 0xffffffff;
          iVar6 = iVar7;
        }
        break;
      case H_KEY:
        cVar1 = (this_00->_M_dataplus)._M_p[uVar8];
        if (cVar1 == ':') {
          if (iVar7 <= iVar6) {
            return PARSE_HEADER_ERROR;
          }
          this->hState_ = H_COLON;
          local_80 = iVar7;
        }
        else {
          if (cVar1 == '\n') {
            return PARSE_HEADER_ERROR;
          }
          if (cVar1 == '\r') {
            return PARSE_HEADER_ERROR;
          }
        }
        break;
      case H_COLON:
        if ((this_00->_M_dataplus)._M_p[uVar8] != ' ') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_SPACES_AFTER_COLON;
        break;
      case H_SPACES_AFTER_COLON:
        this->hState_ = H_VALUE;
        local_84 = iVar7;
        break;
      case H_VALUE:
        if ((this_00->_M_dataplus)._M_p[uVar8] == '\r') {
          this->hState_ = H_CR;
          local_7c = iVar7;
          if (iVar7 <= local_84) {
            return PARSE_HEADER_ERROR;
          }
        }
        else if (0xff < uVar8 - (long)local_84) {
          return PARSE_HEADER_ERROR;
        }
        break;
      case H_CR:
        pcVar2 = (this_00->_M_dataplus)._M_p;
        if (pcVar2[uVar8] != '\n') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_LF;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_78,pcVar2 + iVar6,pcVar2 + local_80);
        pcVar2 = (this->inBuffer_)._M_dataplus._M_p;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_58,pcVar2 + local_84,pcVar2 + local_7c);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_38,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_01,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        uVar5 = (this->inBuffer_)._M_string_length;
        __pos = uVar8 & 0xffffffff;
        break;
      case H_LF:
        if ((this_00->_M_dataplus)._M_p[uVar8] == '\r') {
          this->hState_ = H_END_CR;
        }
        else {
          this->hState_ = H_KEY;
          iVar6 = iVar7;
        }
        break;
      case H_END_CR:
        if ((this_00->_M_dataplus)._M_p[uVar8] != '\n') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_END_LF;
        break;
      case H_END_LF:
        goto LAB_0010938d;
      }
      iVar7 = (int)__pos;
      uVar3 = uVar8 + 1;
    } while (uVar8 + 1 < uVar5);
LAB_0010938d:
    __pos_00 = uVar8 + 1;
    __pos = (size_type)iVar7;
  }
  if (this->hState_ == H_END_LF) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,this_00,__pos_00,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    HVar4 = PARSE_HEADER_SUCCESS;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,this_00,__pos,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    HVar4 = PARSE_HEADER_AGAIN;
  }
  return HVar4;
}

Assistant:

HeaderState HttpData::parseHeaders() {
  string &str = inBuffer_;
  int key_start = -1, key_end = -1, value_start = -1, value_end = -1;
  int now_read_line_begin = 0;
  bool notFinish = true;
  size_t i = 0;
  for (; i < str.size() && notFinish; ++i) {
    switch (hState_) {
      case H_START: {
        if (str[i] == '\n' || str[i] == '\r') break;
        hState_ = H_KEY;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
      case H_KEY: {
        if (str[i] == ':') {
          key_end = i;
          if (key_end - key_start <= 0) return PARSE_HEADER_ERROR;
          hState_ = H_COLON;
        } else if (str[i] == '\n' || str[i] == '\r')
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_COLON: {
        if (str[i] == ' ') {
          hState_ = H_SPACES_AFTER_COLON;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_SPACES_AFTER_COLON: {
        hState_ = H_VALUE;
        value_start = i;
        break;
      }
      case H_VALUE: {
        if (str[i] == '\r') {
          hState_ = H_CR;
          value_end = i;
          if (value_end - value_start <= 0) return PARSE_HEADER_ERROR;
        } else if (i - value_start > 255)
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_CR: {
        if (str[i] == '\n') {
          hState_ = H_LF;
          string key(str.begin() + key_start, str.begin() + key_end);
          string value(str.begin() + value_start, str.begin() + value_end);
          headers_[key] = value;
          now_read_line_begin = i;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_LF: {
        if (str[i] == '\r') {
          hState_ = H_END_CR;
        } else {
          key_start = i;
          hState_ = H_KEY;
        }
        break;
      }
      case H_END_CR: {
        if (str[i] == '\n') {
          hState_ = H_END_LF;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_END_LF: {
        notFinish = false;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
    }
  }
  if (hState_ == H_END_LF) {
    str = str.substr(i);
    return PARSE_HEADER_SUCCESS;
  }
  str = str.substr(now_read_line_begin);
  return PARSE_HEADER_AGAIN;
}